

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O2

void light_pcapng_release(light_pcapng pcapng)

{
  void *__ptr;
  uint32_t uVar1;
  uint uVar2;
  void *__ptr_00;
  ulong uVar3;
  
  uVar1 = light_get_block_count(pcapng);
  __ptr_00 = calloc((ulong)uVar1,8);
  uVar2 = 0;
  for (; pcapng != (light_pcapng)0x0; pcapng = pcapng->next_block) {
    *(light_pcapng *)((long)__ptr_00 + (ulong)uVar2 * 8) = pcapng;
    uVar2 = uVar2 + 1;
  }
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    __ptr = *(void **)((long)__ptr_00 + uVar3 * 8);
    __free_option(*(_light_option **)((long)__ptr + 0x10));
    free(*(void **)((long)__ptr + 8));
    free(__ptr);
  }
  free(__ptr_00);
  return;
}

Assistant:

void light_pcapng_release(light_pcapng pcapng)
{
	light_pcapng iter = pcapng;
	uint32_t block_count = light_get_block_count(pcapng);
	light_pcapng *block_pointers = calloc(block_count, sizeof(light_pcapng));
	uint32_t i = 0;

	while (iter != NULL) {
		block_pointers[i] = iter;
		i++;
		iter = iter->next_block;
	}

	for (i = 0; i < block_count; ++i) {
		__free_option(block_pointers[i]->options);
		free(block_pointers[i]->block_body);
		free(block_pointers[i]);
	}

	free(block_pointers);
}